

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

QPointF __thiscall QGraphicsView::mapToScene(QGraphicsView *this,QPoint *point)

{
  QPointF QVar1;
  QGraphicsViewPrivate *pQVar2;
  qint64 qVar3;
  qreal *pqVar4;
  long in_FS_OFFSET;
  qreal in_XMM1_Qa;
  QGraphicsViewPrivate *d;
  QPointF p;
  QPoint *in_stack_ffffffffffffff48;
  QGraphicsViewPrivate *in_stack_ffffffffffffff50;
  QPointF local_78;
  qreal local_68;
  qreal local_60;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QGraphicsView *)0xa33ea0);
  local_78.xp = -NAN;
  local_78.yp = -NAN;
  QPointF::QPointF((QPointF *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  qVar3 = QGraphicsViewPrivate::horizontalScroll(in_stack_ffffffffffffff50);
  pqVar4 = QPointF::rx(&local_78);
  *pqVar4 = (double)qVar3 + *pqVar4;
  qVar3 = QGraphicsViewPrivate::verticalScroll(in_stack_ffffffffffffff50);
  pqVar4 = QPointF::ry(&local_78);
  *pqVar4 = (double)qVar3 + *pqVar4;
  if ((*(uint *)&pQVar2->field_0x300 >> 4 & 1) == 0) {
    QTransform::inverted((bool *)local_58);
    local_68 = (qreal)QTransform::map((QPointF *)local_58);
    local_60 = in_XMM1_Qa;
  }
  else {
    local_68 = local_78.xp;
    local_60 = local_78.yp;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar1.yp = local_60;
    QVar1.xp = local_68;
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QPointF QGraphicsView::mapToScene(const QPoint &point) const
{
    Q_D(const QGraphicsView);
    QPointF p = point;
    p.rx() += d->horizontalScroll();
    p.ry() += d->verticalScroll();
    return d->identityMatrix ? p : d->matrix.inverted().map(p);
}